

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintStamp.cpp
# Opt level: O2

void __thiscall OpenMD::ConstraintStamp::ConstraintStamp(ConstraintStamp *this)

{
  ParamMap *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  allocator<char> local_79;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_58;
  
  DataHolder::DataHolder(&this->super_DataHolder);
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__ConstraintStamp_002c4fe8;
  (this->ConstrainedDistance).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ConstrainedDistance).super_ParameterBase.keyword_.field_2;
  (this->ConstrainedDistance).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ConstrainedDistance).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ConstrainedDistance).super_ParameterBase.optional_ = false;
  (this->ConstrainedDistance).super_ParameterBase.defaultValue_ = false;
  (this->ConstrainedDistance).super_ParameterBase.empty_ = true;
  (this->ConstrainedDistance).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002c2c58;
  (this->PrintConstraintForce).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->PrintConstraintForce).super_ParameterBase.keyword_.field_2;
  (this->PrintConstraintForce).super_ParameterBase.keyword_._M_string_length = 0;
  (this->PrintConstraintForce).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->PrintConstraintForce).super_ParameterBase.optional_ = false;
  (this->PrintConstraintForce).super_ParameterBase.defaultValue_ = false;
  (this->PrintConstraintForce).super_ParameterBase.empty_ = true;
  (this->PrintConstraintForce).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002c2be0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"constrainedDistance",(allocator<char> *)&local_78);
  std::__cxx11::string::_M_assign
            ((string *)&(this->ConstrainedDistance).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"constrainedDistance",&local_79);
  local_58.first._M_string_length = local_70;
  this_00 = &(this->super_DataHolder).parameters_;
  paVar1 = &local_58.first.field_2;
  if (local_78 == &local_68) {
    local_58.first.field_2._8_8_ = local_68._8_8_;
    local_58.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_58.first._M_dataplus._M_p = (pointer)local_78;
  }
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_78 = &local_68;
  local_58.second = &(this->ConstrainedDistance).super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"printConstraintForce",(allocator<char> *)&local_78);
  std::__cxx11::string::_M_assign
            ((string *)&(this->PrintConstraintForce).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_58);
  (this->PrintConstraintForce).super_ParameterBase.optional_ = true;
  (this->PrintConstraintForce).super_ParameterBase.defaultValue_ = true;
  (this->PrintConstraintForce).super_ParameterBase.empty_ = false;
  (this->PrintConstraintForce).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"printConstraintForce",&local_79);
  local_58.first._M_string_length = local_70;
  if (local_78 == &local_68) {
    local_58.first.field_2._8_8_ = local_68._8_8_;
    local_58.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_58.first._M_dataplus._M_p = (pointer)local_78;
  }
  local_58.first.field_2._M_allocated_capacity._1_7_ = local_68._M_allocated_capacity._1_7_;
  local_58.first.field_2._M_local_buf[0] = local_68._M_local_buf[0];
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_78 = &local_68;
  local_58.second = &(this->PrintConstraintForce).super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

ConstraintStamp::ConstraintStamp() {
    DefineParameter(ConstrainedDistance, "constrainedDistance");
    DefineOptionalParameterWithDefaultValue(PrintConstraintForce,
                                            "printConstraintForce", false);
  }